

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmNinjaTargetGenerator.cxx
# Opt level: O2

string * __thiscall
cmNinjaTargetGenerator::GetPreprocessedFilePath
          (string *__return_storage_ptr__,cmNinjaTargetGenerator *this,cmSourceFile *source,
          string *config)

{
  bool bVar1;
  string *psVar2;
  cmGlobalNinjaGenerator *pcVar3;
  string_view str;
  char local_e9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  string ppExt;
  string local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  string ppName;
  
  psVar2 = cmSourceFile::GetExtension_abi_cxx11_(source);
  std::__cxx11::string::string((string *)&ppExt,(string *)psVar2);
  str._M_str = ppExt._M_dataplus._M_p;
  str._M_len = ppExt._M_string_length;
  bVar1 = cmHasLiteralPrefix<2ul>(str,(char (*) [2])0x708845);
  if (bVar1) {
    cmsys::SystemTools::LowerCase(&local_a8,&ppExt);
    std::__cxx11::string::operator=((string *)&ppExt,(string *)&local_a8);
    std::__cxx11::string::~string((string *)&local_a8);
  }
  bVar1 = std::operator==(&ppExt,"fpp");
  if (bVar1) {
    std::__cxx11::string::assign((char *)&ppExt);
  }
  psVar2 = cmGeneratorTarget::GetObjectName_abi_cxx11_
                     ((this->super_cmCommonTargetGenerator).GeneratorTarget,source);
  pcVar3 = GetGlobalGenerator(this);
  cmGlobalGenerator::GetLanguageOutputExtension_abi_cxx11_
            (&local_a8,(cmGlobalGenerator *)pcVar3,source);
  if (local_a8._M_string_length <= psVar2->_M_string_length) {
    std::__cxx11::string::substr((ulong)&local_e8,(ulong)psVar2);
    cmStrCat<std::__cxx11::string,char_const(&)[5],std::__cxx11::string&>
              (&ppName,&local_e8,(char (*) [5])"-pp.",&ppExt);
    std::__cxx11::string::~string((string *)&local_e8);
    std::__cxx11::string::string
              ((string *)__return_storage_ptr__,
               (string *)&this->LocalGenerator->HomeRelativeOutputPath);
    if (__return_storage_ptr__->_M_string_length != 0) {
      std::__cxx11::string::push_back((char)__return_storage_ptr__);
    }
    (*(this->LocalGenerator->super_cmLocalCommonGenerator).super_cmLocalGenerator.
      super_cmOutputConverter._vptr_cmOutputConverter[0x10])
              (&local_68,this->LocalGenerator,(this->super_cmCommonTargetGenerator).GeneratorTarget)
    ;
    pcVar3 = GetGlobalGenerator(this);
    (*(pcVar3->super_cmGlobalCommonGenerator).super_cmGlobalGenerator._vptr_cmGlobalGenerator[0x4d])
              (&local_88,pcVar3,config);
    local_e9 = '/';
    cmStrCat<std::__cxx11::string,std::__cxx11::string,char,std::__cxx11::string_const&>
              (&local_e8,&local_68,&local_88,&local_e9,&ppName);
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&local_e8);
    std::__cxx11::string::~string((string *)&local_88);
    std::__cxx11::string::~string((string *)&local_68);
    std::__cxx11::string::~string((string *)&ppName);
    std::__cxx11::string::~string((string *)&local_a8);
    std::__cxx11::string::~string((string *)&ppExt);
    return __return_storage_ptr__;
  }
  __assert_fail("objName.size() >= objExt.size()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmNinjaTargetGenerator.cxx"
                ,0x1eb,
                "std::string cmNinjaTargetGenerator::GetPreprocessedFilePath(const cmSourceFile *, const std::string &) const"
               );
}

Assistant:

std::string cmNinjaTargetGenerator::GetPreprocessedFilePath(
  cmSourceFile const* source, const std::string& config) const
{
  // Choose an extension to compile already-preprocessed source.
  std::string ppExt = source->GetExtension();
  if (cmHasLiteralPrefix(ppExt, "F")) {
    // Some Fortran compilers automatically enable preprocessing for
    // upper-case extensions.  Since the source is already preprocessed,
    // use a lower-case extension.
    ppExt = cmSystemTools::LowerCase(ppExt);
  }
  if (ppExt == "fpp") {
    // Some Fortran compilers automatically enable preprocessing for
    // the ".fpp" extension.  Since the source is already preprocessed,
    // use the ".f" extension.
    ppExt = "f";
  }

  // Take the object file name and replace the extension.
  std::string const& objName = this->GeneratorTarget->GetObjectName(source);
  std::string const& objExt =
    this->GetGlobalGenerator()->GetLanguageOutputExtension(*source);
  assert(objName.size() >= objExt.size());
  std::string const ppName =
    cmStrCat(objName.substr(0, objName.size() - objExt.size()), "-pp.", ppExt);

  std::string path = this->LocalGenerator->GetHomeRelativeOutputPath();
  if (!path.empty()) {
    path += '/';
  }
  path +=
    cmStrCat(this->LocalGenerator->GetTargetDirectory(this->GeneratorTarget),
             this->GetGlobalGenerator()->ConfigDirectory(config), '/', ppName);
  return path;
}